

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

int __thiscall gl3cts::CommonBugsTests::init(CommonBugsTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  SparseBuffersWithCopyOpsTest *this_00;
  
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,
             "CommonBug_GetProgramivActiveUniformBlockMaxNameLength",
             "Verifies GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH pname is recognized by glGetProgramiv()"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020edd30;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"CommonBug_InputVariablesCannotBeModified",
             "Verifies that input variables cannot be modified.");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020edd68;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,
             "CommonBug_InvalidUseCasesForAllNotFuncsAndExclMarkOp",
             "Verifies that ! operator does not accept bvec{2,3,4} arguments, all() and not() functions do not accept a bool argument."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020edda0;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"CommonBug_InvalidVSInputs",
             "Verifies that invalid types, as well as incompatible qualifiers, are not accepted for vertex shader input variable declarations"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020eddd8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,
             "CommonBug_ParenthesisInLayoutQualifierIntegerValue",
             "Verifies parenthesis are not accepted in compute shaders, prior to GL4.4, unless GL_ARB_enhanced_layouts is supported."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020ede10;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"CommonBug_PerVertexValidation",
             "Conformance test which verifies that various requirements regarding gl_PerVertex block re-declarations, as described by the spec, are followed by the implementation"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020ede48;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 0xc) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"CommonBug_ReservedNames",
             "Verifies that reserved variable names are rejected by the GL SL compiler at the compilation time."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020ede80;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 8) = 0;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&pTVar2[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar2[1].m_description._M_string_length + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_00 = (SparseBuffersWithCopyOpsTest *)operator_new(0xb0);
  SparseBuffersWithCopyOpsTest::SparseBuffersWithCopyOpsTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void CommonBugsTests::init()
{
	addChild(new GetProgramivActiveUniformBlockMaxNameLengthTest(m_context));
	addChild(new InputVariablesCannotBeModifiedTest(m_context));
	addChild(new InvalidUseCasesForAllNotFuncsAndExclMarkOpTest(m_context));
	addChild(new InvalidVSInputsTest(m_context));
	addChild(new ParenthesisInLayoutQualifierIntegerValuesTest(m_context));
	addChild(new PerVertexValidationTest(m_context));
	addChild(new ReservedNamesTest(m_context));
	addChild(new SparseBuffersWithCopyOpsTest(m_context));
}